

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall YAJLFrame::YAJLFrame(YAJLFrame *this,YAJLMiscData *misc,bitio_stream *bstream)

{
  YAJLFrameHeader *pYVar1;
  undefined8 *puVar2;
  pointer pYVar3;
  pointer pYVar4;
  u16 marker;
  uint uVar5;
  long lVar6;
  ssize_t sVar7;
  undefined8 extraout_RAX;
  short sVar8;
  size_t in_RCX;
  bitio_stream *extraout_RDX;
  bitio_stream *extraout_RDX_00;
  bitio_stream *extraout_RDX_01;
  bitio_stream *extraout_RDX_02;
  void *__buf;
  bitio_stream *extraout_RDX_03;
  YAJLFrame *this_00;
  YAJLFrame *local_60;
  YAJLMiscData *local_58;
  YAJLFrameHeader local_50;
  
  lVar6 = 0x48;
  do {
    puVar2 = (undefined8 *)((long)&(this->tables).qtables[0].coeffs + lVar6);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x108);
  pYVar1 = &this->header;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = (YAJLFrame *)bstream;
  local_58 = misc;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            this_00 = local_60;
            sVar7 = bitio::bitio_stream::read((bitio_stream *)local_60,0x10,bstream,in_RCX);
            uVar5 = (uint)sVar7;
            in_RCX = (size_t)(uVar5 & 0xfff0);
            sVar8 = (short)(uVar5 & 0xfff0);
            if (sVar8 != -0x20) break;
            YAJLMiscData::fetch_app_data(local_58,(bitio_stream *)local_60);
            bstream = extraout_RDX;
          }
          marker = (u16)sVar7;
          if (marker != 0xffdb) break;
          YAJLTables::fetch_qtable(&this->tables,(bitio_stream *)local_60);
          bstream = extraout_RDX_01;
        }
        if ((uVar5 & 0xffff) != 0xfffe) break;
        YAJLMiscData::fetch_comment(local_58,(bitio_stream *)local_60);
        bstream = extraout_RDX_00;
      }
      if ((uVar5 & 0xfff7) != 0xffc4) break;
      YAJLTables::fetch_etable(&this->tables,marker,(bitio_stream *)local_60);
      bstream = extraout_RDX_02;
    }
    if ((uVar5 & 0xffff) != 0xffdc) break;
    bitio::bitio_stream::skip((bitio_stream *)local_60,0x10);
    sVar7 = bitio::bitio_stream::read((bitio_stream *)local_60,0x10,__buf,in_RCX);
    (this->header).nlines = (u16)sVar7;
    bstream = extraout_RDX_03;
  }
  if ((sVar8 == -0x40) &&
     ((uVar5 = (uVar5 & 0xffff) - 0xffc4, 8 < uVar5 || ((0x111U >> (uVar5 & 0x1f) & 1) == 0)))) {
    YAJLFrameHeader::YAJLFrameHeader(&local_50,marker,(bitio_stream *)local_60);
    (this->header).ncomponents = local_50.ncomponents;
    pYVar1->sof = local_50.sof;
    pYVar1->precision = local_50.precision;
    pYVar1->field_0x3 = local_50._3_1_;
    pYVar1->nlines = local_50.nlines;
    pYVar1->nsamples_per_line = local_50.nsamples_per_line;
    pYVar3 = (this->header).specs.
             super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
             super__Vector_impl_data._M_start;
    pYVar4 = (this->header).specs.
             super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->header).specs.
    super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_50.specs.
         super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->header).specs.
    super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_50.specs.
         super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->header).specs.
    super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_50.specs.
         super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_50.specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pYVar3 != (pointer)0x0) {
      operator_delete(pYVar3,(long)pYVar4 - (long)pYVar3);
      if (local_50.specs.
          super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.specs.
                        super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.specs.
                              super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.specs.
                              super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_50._0_8_ = pYVar1;
    std::vector<YAJLScan,std::allocator<YAJLScan>>::
    emplace_back<YAJLMiscData*&,YAJLFrameHeader*,bitio::bitio_stream*&>
              ((vector<YAJLScan,std::allocator<YAJLScan>> *)&this->scans,&local_58,
               (YAJLFrameHeader **)&local_50,(bitio_stream **)&local_60);
    printf("Run completed at: %s for \'Frame\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
          );
    return;
  }
  YAJLFrame(this_00);
  std::vector<YAJLScan,_std::allocator<YAJLScan>_>::~vector(&this->scans);
  pYVar3 = (this->header).specs.
           super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pYVar3 != (pointer)0x0) {
    operator_delete(pYVar3,(long)(this->header).specs.
                                 super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pYVar3);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

YAJLFrame::YAJLFrame(YAJLMiscData *misc, bitio::bitio_stream *bstream) {
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::DNL) {
            // skip the length parameter as we know that Nl is a u16.
            bstream->skip(0x10);
            header.nlines = bstream->read(0x10);
        } else if (markers::is_sof_marker(marker)) {
            header = YAJLFrameHeader(marker, bstream);
            // now we parse one Scan

            scans.emplace_back(misc, &header, bstream);
#ifdef DEBUG
            printf("Run completed at: %s for 'Frame'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}